

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void luaC_fix(lua_State *L,GCObject *o)

{
  global_State *pgVar1;
  global_State *g;
  GCObject *o_local;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  if (pgVar1->allgc == o) {
    o->marked = o->marked & 0xfc;
    pgVar1->allgc = o->next;
    o->next = pgVar1->fixedgc;
    pgVar1->fixedgc = o;
  }
  return;
}

Assistant:

void luaC_fix (lua_State *L, GCObject *o) {
  global_State *g = G(L);
  if (g->allgc != o)
	  return;  /* if object is not 1st in 'allgc' list, it is in global short string table */
  white2gray(o);  /* they will be gray forever */
  g->allgc = o->next;  /* remove object from 'allgc' list */
  o->next = g->fixedgc;  /* link it to 'fixedgc' list */
  g->fixedgc = o;
}